

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O0

void __thiscall SemanticAnalyser::visit(SemanticAnalyser *this,VariableDeclarationNode *node)

{
  bool bVar1;
  string *psVar2;
  _Storage<std::reference_wrapper<Symbol>,_true> this_00;
  element_type *peVar3;
  shared_ptr<ExpressionNode> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  unique_ptr<VariableSymbol,_std::default_delete<VariableSymbol>_> *__u;
  undefined1 uVar4;
  VariableDeclarationNode *in_RSI;
  string *in_RDI;
  optional<std::reference_wrapper<Symbol>_> oVar5;
  Node *in_stack_00000048;
  string *in_stack_00000050;
  __single_object variableSymbol;
  TypeChecker typeChecker;
  optional<std::reference_wrapper<Symbol>_> symbol;
  string name;
  SymbolTable *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  unique_ptr<VariableSymbol,_std::default_delete<VariableSymbol>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  unique_ptr<Symbol,_std::default_delete<Symbol>_> *in_stack_fffffffffffffe60;
  TypeName *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  int maxDepth;
  string *this_02;
  undefined7 in_stack_fffffffffffffeb8;
  unique_ptr<VariableSymbol,_std::default_delete<VariableSymbol>_> local_138 [18];
  TypeChecker local_a8 [4];
  _Storage<std::reference_wrapper<Symbol>,_true> local_40;
  undefined1 local_38;
  string local_30 [32];
  VariableDeclarationNode *local_10;
  
  maxDepth = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  local_10 = in_RSI;
  psVar2 = VariableDeclarationNode::getName_abi_cxx11_(in_RSI);
  this_02 = local_30;
  std::__cxx11::string::string(this_02,(string *)psVar2);
  oVar5 = SymbolTable::lookup((SymbolTable *)this_02,in_RDI,maxDepth);
  this_00 = oVar5.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
            super__Optional_payload_base<std::reference_wrapper<Symbol>_>._M_payload;
  uVar4 = oVar5.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
          super__Optional_payload_base<std::reference_wrapper<Symbol>_>._M_engaged;
  local_40 = this_00;
  local_38 = uVar4;
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::reference_wrapper<Symbol>_> *)0x14cf0e);
  if (bVar1) {
    std::operator+(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    std::operator+(in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50);
    reportError(in_stack_00000050,in_stack_00000048);
  }
  VariableDeclarationNode::getValue(local_10);
  peVar3 = std::__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x14cfea);
  (*(peVar3->super_Node)._vptr_Node[2])(peVar3,in_RDI);
  TypeChecker::TypeChecker((TypeChecker *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  __lhs = VariableDeclarationNode::getValue(local_10);
  peVar3 = std::__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x14d033);
  (*(peVar3->super_Node)._vptr_Node[2])(peVar3,local_a8);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          TypeChecker::getType(local_a8);
  bVar1 = std::optional<TypeName>::has_value((optional<TypeName> *)0x14d067);
  if (bVar1) {
    TypeChecker::getType(local_a8);
    VariableDeclarationNode::getType(local_10);
    in_stack_fffffffffffffe7f =
         std::operator!=((optional<TypeName> *)in_stack_fffffffffffffe50,
                         (TypeName *)in_stack_fffffffffffffe48);
    if ((bool)in_stack_fffffffffffffe7f) {
      TypeChecker::getType(local_a8);
      std::optional<TypeName>::value((optional<TypeName> *)in_stack_fffffffffffffe50);
      std::
      unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::at((unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)in_stack_fffffffffffffe50,(key_type *)in_stack_fffffffffffffe48);
      std::operator+((char *)__lhs,__rhs);
      std::operator+(in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50);
      std::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
      std::operator+(in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50);
      reportError(in_stack_00000050,in_stack_00000048);
    }
  }
  __u = (unique_ptr<VariableSymbol,_std::default_delete<VariableSymbol>_> *)
        VariableDeclarationNode::getType(local_10);
  std::make_unique<VariableSymbol,std::__cxx11::string_const&,TypeName_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),in_stack_fffffffffffffe70
            );
  this_01 = local_138;
  std::unique_ptr<Symbol,std::default_delete<Symbol>>::
  unique_ptr<VariableSymbol,std::default_delete<VariableSymbol>,void>(in_stack_fffffffffffffe60,__u)
  ;
  SymbolTable::addSymbol
            ((SymbolTable *)this_00,(string *)CONCAT17(uVar4,in_stack_fffffffffffffeb8),
             (unique_ptr<Symbol,_std::default_delete<Symbol>_> *)this_02);
  std::unique_ptr<Symbol,_std::default_delete<Symbol>_>::~unique_ptr(in_stack_fffffffffffffe60);
  std::unique_ptr<VariableSymbol,_std::default_delete<VariableSymbol>_>::~unique_ptr(this_01);
  TypeChecker::~TypeChecker((TypeChecker *)0x14d2c2);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void SemanticAnalyser::visit(const VariableDeclarationNode& node) 
{
  const auto name = node.getName();
  const auto symbol = symbols_.lookup(name, 1);
  if(symbol)
    reportError("Redefinition of variable " + name + "!", node);
  
  node.getValue()->accept(*this);

  TypeChecker typeChecker{symbols_};
  node.getValue()->accept(typeChecker);

  // Type checker is not able to deduce expression's type when variable was called
  // and in that case getType has no value.
  if(typeChecker.getType().has_value() && typeChecker.getType() != node.getType())
    reportError("Cannot assign value of type " + 
      TypeNameStrings.at(typeChecker.getType().value()) + " to variable " + name + "!", node);

  auto variableSymbol = std::make_unique<VariableSymbol>(name, node.getType());
  symbols_.addSymbol(name, std::move(variableSymbol));
}